

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesOverclockGetControlState
          (zes_overclock_handle_t hDomainHandle,zes_overclock_control_t DomainControl,
          zes_control_state_t *pControlState,zes_pending_action_t *pPendingAction)

{
  zes_pfnOverclockGetControlState_t pfnGetControlState;
  ze_result_t result;
  zes_pending_action_t *pPendingAction_local;
  zes_control_state_t *pControlState_local;
  zes_overclock_control_t DomainControl_local;
  zes_overclock_handle_t hDomainHandle_local;
  
  pfnGetControlState._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cb60 != (code *)0x0) {
    pfnGetControlState._4_4_ =
         (*DAT_0011cb60)(hDomainHandle,DomainControl,pControlState,pPendingAction);
  }
  return pfnGetControlState._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesOverclockGetControlState(
        zes_overclock_handle_t hDomainHandle,           ///< [in] Handle for the component domain.
        zes_overclock_control_t DomainControl,          ///< [in] Domain Control.
        zes_control_state_t* pControlState,             ///< [out] Current overclock control state.
        zes_pending_action_t* pPendingAction            ///< [out] Pending overclock setting.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetControlState = context.zesDdiTable.Overclock.pfnGetControlState;
        if( nullptr != pfnGetControlState )
        {
            result = pfnGetControlState( hDomainHandle, DomainControl, pControlState, pPendingAction );
        }
        else
        {
            // generic implementation
        }

        return result;
    }